

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool __thiscall cmListCommand::GetListString(cmListCommand *this,string *listString,string *var)

{
  char *pcVar1;
  char *cacheValue;
  string *var_local;
  string *listString_local;
  cmListCommand *this_local;
  
  pcVar1 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,var);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)listString,pcVar1);
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool cmListCommand::GetListString(std::string& listString,
                                  const std::string& var)
{
  // get the old value
  const char* cacheValue
    = this->Makefile->GetDefinition(var);
  if(!cacheValue)
    {
    return false;
    }
  listString = cacheValue;
  return true;
}